

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O2

bool has_phong_mat(aiScene *scene)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  float shininess;
  ai_real local_2c;
  
  uVar2 = 0;
  do {
    uVar3 = uVar2;
    uVar1 = scene->mNumMaterials;
    if (uVar1 <= uVar3) break;
    local_2c = 0.0;
    aiGetMaterialFloat(scene->mMaterials[uVar3],"$mat.shininess",0,0,&local_2c);
    uVar2 = uVar3 + 1;
  } while (local_2c <= 0.0);
  return uVar3 < uVar1;
}

Assistant:

bool has_phong_mat(const aiScene* scene)
{
    // just search for any material with a shininess exponent
    for (size_t i = 0; i < scene->mNumMaterials; ++i) {
        aiMaterial* mat = scene->mMaterials[i];
        float shininess = 0;
        mat->Get(AI_MATKEY_SHININESS, shininess);
        if (shininess > 0) {
            return true;
        }
    }
    return false;
}